

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printPCRelImm(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  long local_30;
  int64_t imm;
  MCOperand *Op;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var2 = MCOperand_isImm(op);
  if (_Var2) {
    iVar3 = MCOperand_getImm(op);
    local_30 = iVar3 + (ulong)MI->flat_insn->size + MI->address;
    if (local_30 < 0) {
      SStream_concat(O,"0x%lx",local_30);
    }
    else {
      if ((MI->csh->mode == CS_MODE_16) && (0x100000 < local_30)) {
        local_30 = local_30 + -0x10000;
      }
      if (local_30 < 10) {
        SStream_concat(O,"%lu",local_30);
      }
      else {
        SStream_concat(O,"0x%lx",local_30);
      }
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar4 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
      puVar4[0] = '\x02';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      MI->has_imm = true;
      *(long *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = local_30;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
    }
  }
  return;
}

Assistant:

static void printPCRelImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op) + MI->flat_insn->size + MI->address;
		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, imm);
		} else {
			// handle 16bit segment bound
			if (MI->csh->mode == CS_MODE_16 && imm > 0x100000)
				imm -= 0x10000;

			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
			MI->has_imm = true;
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
			MI->flat_insn->detail->x86.op_count++;
		}
	}
}